

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

bool __thiscall testing::internal::linked_ptr_internal::depart(linked_ptr_internal *this)

{
  MutexBase *in_RDI;
  linked_ptr_internal *p;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  long *local_28;
  bool local_1;
  
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)in_RDI,in_stack_ffffffffffffffc8);
  if ((MutexBase *)(in_RDI->mutex_).__align == in_RDI) {
    local_1 = true;
  }
  else {
    for (local_28 = *(long **)&in_RDI->mutex_; (MutexBase *)*local_28 != in_RDI;
        local_28 = (long *)*local_28) {
    }
    *local_28 = (in_RDI->mutex_).__align;
    local_1 = false;
  }
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1a7fdf);
  return local_1;
}

Assistant:

bool depart()
      GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    if (next_ == this) return true;
    linked_ptr_internal const* p = next_;
    while (p->next_ != this) p = p->next_;
    p->next_ = next_;
    return false;
  }